

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_NtkTimeSetDefaultInputDrive(Abc_Ntk_t *pNtk,float Rise,float Fall)

{
  float fVar1;
  int iVar2;
  Abc_ManTime_t *pAVar3;
  int local_1c;
  int i;
  float Fall_local;
  float Rise_local;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk->pManTime == (Abc_ManTime_t *)0x0) {
    pAVar3 = Abc_ManTimeStart(pNtk);
    pNtk->pManTime = pAVar3;
  }
  (pNtk->pManTime->tInDriveDef).Rise = Rise;
  (pNtk->pManTime->tInDriveDef).Fall = Fall;
  if (pNtk->pManTime->tInDrive != (Abc_Time_t *)0x0) {
    for (local_1c = 0; iVar2 = Abc_NtkCiNum(pNtk), local_1c < iVar2; local_1c = local_1c + 1) {
      fVar1 = pNtk->pManTime->tInDrive[local_1c].Rise;
      if ((((fVar1 == 0.0) && (!NAN(fVar1))) &&
          (fVar1 = pNtk->pManTime->tInDrive[local_1c].Fall, fVar1 == 0.0)) && (!NAN(fVar1))) {
        pNtk->pManTime->tInDrive[local_1c] = pNtk->pManTime->tInDriveDef;
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkTimeSetDefaultInputDrive( Abc_Ntk_t * pNtk, float Rise, float Fall )
{
//    if ( Rise == 0.0 && Fall == 0.0 )
//        return;
    if ( pNtk->pManTime == NULL )
        pNtk->pManTime = Abc_ManTimeStart(pNtk);
    pNtk->pManTime->tInDriveDef.Rise  = Rise;
    pNtk->pManTime->tInDriveDef.Fall  = Fall;
    if ( pNtk->pManTime->tInDrive != NULL )
    {
        int i;
        for ( i = 0; i < Abc_NtkCiNum(pNtk); i++ )
            if ( pNtk->pManTime->tInDrive[i].Rise == 0 && pNtk->pManTime->tInDrive[i].Fall == 0 )
                pNtk->pManTime->tInDrive[i] = pNtk->pManTime->tInDriveDef;
    }
}